

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_store_dbatu_ppc64(CPUPPCState_conflict2 *env,uint32_t nr,target_ulong value)

{
  ulong mask_00;
  target_ulong mask;
  target_ulong value_local;
  uint32_t nr_local;
  CPUPPCState_conflict2 *env_local;
  
  dump_store_bat(env,'D',0,nr,value);
  if (env->DBAT[0][nr] != value) {
    do_invalidate_BAT(env,env->DBAT[0][nr],(value & 0x1ffc) << 0xf);
    mask_00 = (value & 0x1ffc) << 0xf;
    env->DBAT[0][nr] = value & 0x1fff | value & 0xfffffffffffe0000 & (mask_00 ^ 0xffffffffffffffff);
    env->DBAT[1][nr] =
         env->DBAT[1][nr] & 0x7b |
         env->DBAT[1][nr] & 0xfffffffffffe0000 & (mask_00 ^ 0xffffffffffffffff);
    do_invalidate_BAT(env,env->DBAT[0][nr],mask_00);
  }
  return;
}

Assistant:

void helper_store_dbatu(CPUPPCState *env, uint32_t nr, target_ulong value)
{
    target_ulong mask;
#if defined(FLUSH_ALL_TLBS)
    PowerPCCPU *cpu = env_archcpu(env);
#endif

    dump_store_bat(env, 'D', 0, nr, value);
    if (env->DBAT[0][nr] != value) {
        /*
         * When storing valid upper BAT, mask BEPI and BRPN and
         * invalidate all TLBs covered by this BAT
         */
        mask = (value << 15) & 0x0FFE0000UL;
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#endif
        mask = (value << 15) & 0x0FFE0000UL;
        env->DBAT[0][nr] = (value & 0x00001FFFUL) |
            (value & ~0x0001FFFFUL & ~mask);
        env->DBAT[1][nr] = (env->DBAT[1][nr] & 0x0000007B) |
            (env->DBAT[1][nr] & ~0x0001FFFF & ~mask);
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#else
        tlb_flush(env_cpu(env));
#endif
    }
}